

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O1

BigInt * __thiscall BigInt::operator+(BigInt *__return_storage_ptr__,BigInt *this,BigInt *that)

{
  iterator __position;
  pointer plVar1;
  bool bVar2;
  longlong lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  BigInt *res;
  ulong uVar8;
  BigInt res_1;
  BigInt local_50;
  
  if (this->sign == that->sign) {
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&__return_storage_ptr__->vector_value,&that->vector_value);
    __return_storage_ptr__->sign = that->sign;
    uVar4 = (long)(this->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    uVar6 = (long)(that->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(that->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    if (uVar6 < uVar4) {
      uVar6 = uVar4;
    }
    if (0 < (int)uVar6) {
      uVar4 = 0;
      uVar6 = 0;
      do {
        __position._M_current =
             (__return_storage_ptr__->vector_value).
             super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (uVar4 == ((ulong)((long)__position._M_current -
                             (long)(__return_storage_ptr__->vector_value).
                                   super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                                   .super__Vector_impl_data._M_start) >> 3 & 0xffffffff)) {
          local_50.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          if (__position._M_current ==
              (__return_storage_ptr__->vector_value).
              super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<long_long>
                      (&__return_storage_ptr__->vector_value,__position,(longlong *)&local_50);
          }
          else {
            *__position._M_current = 0;
            (__return_storage_ptr__->vector_value).
            super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        plVar1 = (this->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((long)uVar4 <
            (long)(int)((ulong)((long)(this->vector_value).
                                      super__Vector_base<long_long,_std::allocator<long_long>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)plVar1) >> 3
                       )) {
          lVar5 = plVar1[uVar4];
        }
        else {
          lVar5 = 0;
        }
        plVar1 = (__return_storage_ptr__->vector_value).
                 super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar5 = lVar5 + uVar6 + plVar1[uVar4];
        plVar1[uVar4] = lVar5;
        lVar3 = base;
        bVar2 = base <= lVar5;
        if (base <= lVar5) {
          plVar1[uVar4] = lVar5 - base;
        }
        uVar6 = (ulong)bVar2;
        uVar4 = uVar4 + 1;
        uVar8 = (long)(this->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3;
        uVar7 = (long)(that->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(that->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3;
        if (uVar7 < uVar8) {
          uVar7 = uVar8;
        }
      } while ((lVar3 <= lVar5) || ((int)uVar4 < (int)uVar7));
    }
  }
  else {
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&local_50.vector_value,&that->vector_value);
    local_50.sign = -that->sign;
    operator-(__return_storage_ptr__,this,&local_50);
    if (local_50.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.vector_value.
                      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt operator+(const BigInt &that) const { //! addition operator overloading
        if (sign == that.sign) {
            BigInt res = that; //! initialize with THAT, even both are negatives this will work

            //! keep looping for all digits until exhausted considering the carry (go from the least significant digit)
            for (int i = 0, carry = 0; i < (int) max(vector_value.size(), that.vector_value.size()) || carry; ++i) {

                if (i == (int) res.vector_value.size())
                    res.vector_value.push_back(0); //! due to carry the result may be n+1

                //! accumulate to this digit
                res.vector_value[i] += carry + (i < (int) vector_value.size() ? vector_value[i] : 0);

                //! make a carry to the next digit if sum can't fit in this digit
                //! same as carry = sum / base
                carry = res.vector_value[i] >= base;

                if (carry)
                    res.vector_value[i] -= base; //!keep only the remainder = sum % base
            }

            return res;
        }

        //! A+B have different signs represent them as difference
        return *this - (-that);
    }